

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O1

uint32_t ogt_vox_sample_anim_model(ogt_vox_anim_model *anim,uint32_t frame_index)

{
  uint32_t uVar1;
  bool bVar2;
  ogt_vox_keyframe_model *poVar3;
  uint uVar4;
  ulong uVar5;
  
  if (anim->num_keyframes == 0) {
    __assert_fail("(anim->num_keyframes >= 1) && (\"need at least one keyframe to sample\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0x518,"uint32_t ogt_vox_sample_anim_model(const ogt_vox_anim_model *, uint32_t)")
    ;
  }
  if (anim->loop == true) {
    frame_index = compute_looped_frame_index
                            (anim->keyframes->frame_index,
                             anim->keyframes[anim->num_keyframes - 1].frame_index,frame_index);
  }
  poVar3 = anim->keyframes;
  if (poVar3->frame_index < frame_index) {
    uVar1 = anim->num_keyframes;
    if (frame_index < poVar3[uVar1 - 1].frame_index) {
      bVar2 = (int)uVar1 < 2;
      if (1 < (int)uVar1) {
        uVar5 = (ulong)(uVar1 - 2);
        if (frame_index < poVar3[uVar5].frame_index) {
          uVar4 = uVar1 - 3;
          do {
            bVar2 = (int)(uVar4 + 1) < 1;
            if ((int)(uVar4 + 1) < 1) goto LAB_00102ae0;
            uVar5 = (ulong)uVar4;
            uVar4 = uVar4 - 1;
          } while (frame_index < poVar3[uVar5].frame_index);
        }
        frame_index = poVar3[uVar5].model_index;
      }
LAB_00102ae0:
      if (!bVar2) {
        return frame_index;
      }
      __assert_fail("(0) && (\"shouldn\'t reach here\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                    ,0x525,
                    "uint32_t ogt_vox_sample_anim_model(const ogt_vox_anim_model *, uint32_t)");
    }
    poVar3 = poVar3 + (uVar1 - 1);
  }
  return poVar3->model_index;
}

Assistant:

uint32_t ogt_vox_sample_anim_model(const ogt_vox_anim_model* anim, uint32_t frame_index)
    {
        ogt_assert(anim->num_keyframes >= 1, "need at least one keyframe to sample");
        if (anim->loop) {
            frame_index = compute_looped_frame_index(anim->keyframes[0].frame_index, anim->keyframes[anim->num_keyframes-1].frame_index, frame_index);
        }
        if (frame_index <= anim->keyframes[0].frame_index)
            return anim->keyframes[0].model_index;
        if (frame_index >=anim-> keyframes[anim->num_keyframes-1].frame_index)
            return anim->keyframes[anim->num_keyframes-1].model_index;
        for (int32_t f = (int32_t)anim->num_keyframes-2; f >= 0; f--) {
            if (frame_index >= anim->keyframes[f].frame_index) {
                return anim->keyframes[f+0].model_index;
            }
        }
        ogt_assert(0, "shouldn't reach here");
        return anim->keyframes[0].model_index;
    }